

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

void btRemoveRowCol(btScalar *A,int n,int nskip,int r)

{
  int iVar1;
  btScalar *pbVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = n + -1;
  if (r < iVar1) {
    if (0 < r) {
      iVar4 = ~r + n;
      pbVar2 = A + (ulong)(uint)r + 1;
      iVar3 = r;
      do {
        memmove(pbVar2 + -1,pbVar2,(long)iVar4 << 2);
        pbVar2 = pbVar2 + nskip;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      if (r < iVar1) {
        pbVar2 = A + r * nskip;
        do {
          memcpy(pbVar2,pbVar2 + nskip,(ulong)(uint)r << 2);
          iVar4 = iVar4 + -1;
          pbVar2 = pbVar2 + nskip;
        } while (iVar4 != 0);
      }
    }
    if (r < iVar1) {
      iVar3 = ~r + n;
      lVar5 = (long)iVar3;
      iVar1 = nskip + 1;
      pbVar2 = A + r * iVar1;
      do {
        memcpy(pbVar2,pbVar2 + iVar1,lVar5 << 2);
        pbVar2 = pbVar2 + (long)iVar1 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  return;
}

Assistant:

void btRemoveRowCol (btScalar *A, int n, int nskip, int r)
{
  btAssert(A && n > 0 && nskip >= n && r >= 0 && r < n);
  if (r >= n-1) return;
  if (r > 0) {
    {
      const size_t move_size = (n-r-1)*sizeof(btScalar);
      btScalar *Adst = A + r;
      for (int i=0; i<r; Adst+=nskip,++i) {
        btScalar *Asrc = Adst + 1;
        memmove (Adst,Asrc,move_size);
      }
    }
    {
      const size_t cpy_size = r*sizeof(btScalar);
      btScalar *Adst = A + r * nskip;
      for (int i=r; i<(n-1); ++i) {
        btScalar *Asrc = Adst + nskip;
        memcpy (Adst,Asrc,cpy_size);
        Adst = Asrc;
      }
    }
  }
  {
    const size_t cpy_size = (n-r-1)*sizeof(btScalar);
    btScalar *Adst = A + r * (nskip + 1);
    for (int i=r; i<(n-1); ++i) {
      btScalar *Asrc = Adst + (nskip + 1);
      memcpy (Adst,Asrc,cpy_size);
      Adst = Asrc - 1;
    }
  }
}